

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseNumberArrayProperty
               (vector<double,_std::allocator<double>_> *ret,string *err,json *o,string *property,
               bool required,string *parent_node)

{
  primitive_iterator_t *__return_storage_ptr__;
  bool bVar1;
  char *member;
  ulong uVar2;
  json *pjVar3;
  reference o_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_179;
  bool isNumber;
  double numberValue;
  json_const_array_iterator i;
  json_const_array_iterator end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  json_const_iterator it;
  string *parent_node_local;
  bool required_local;
  string *property_local;
  json *o_local;
  string *err_local;
  vector<double,_std::allocator<double>_> *ret_local;
  
  it.m_it.primitive_iterator.m_it = (difference_type)parent_node;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::iter_impl((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *)local_60);
  member = (char *)std::__cxx11::string::c_str();
  bVar1 = anon_unknown_57::FindMember(o,member,(json_const_iterator *)local_60);
  if (bVar1) {
    pjVar3 = anon_unknown_57::GetValue((json_const_iterator *)local_60);
    bVar1 = anon_unknown_57::IsArray(pjVar3);
    if (bVar1) {
      std::vector<double,_std::allocator<double>_>::clear(ret);
      pjVar3 = anon_unknown_57::GetValue((json_const_iterator *)local_60);
      anon_unknown_57::ArrayEnd((json_const_array_iterator *)&i.m_it.primitive_iterator,pjVar3);
      pjVar3 = anon_unknown_57::GetValue((json_const_iterator *)local_60);
      anon_unknown_57::ArrayBegin((json_const_array_iterator *)&numberValue,pjVar3);
      while (bVar1 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                   *)&numberValue,
                                  (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                   *)&i.m_it.primitive_iterator), bVar1) {
        o_00 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&numberValue);
        local_179 = anon_unknown_57::GetNumber(o_00,(double *)&stack0xfffffffffffffe88);
        if (!(bool)local_179) {
          if ((required) && (err != (string *)0x0)) {
            std::operator+(&local_1c0,"\'",property);
            std::operator+(&local_1a0,&local_1c0,"\' property is not a number.\n");
            std::__cxx11::string::operator+=((string *)err,(string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_1c0);
            uVar2 = std::__cxx11::string::empty();
            if ((uVar2 & 1) == 0) {
              std::operator+(&local_1e0," in ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             it.m_it.primitive_iterator.m_it);
              std::__cxx11::string::operator+=((string *)err,(string *)&local_1e0);
              std::__cxx11::string::~string((string *)&local_1e0);
            }
            std::__cxx11::string::operator+=((string *)err,".\n");
          }
          return false;
        }
        std::vector<double,_std::allocator<double>_>::push_back
                  (ret,(value_type_conflict8 *)&stack0xfffffffffffffe88);
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      *)&numberValue);
      }
      ret_local._7_1_ = true;
    }
    else {
      if ((required) && (err != (string *)0x0)) {
        std::operator+(&local_110,"\'",property);
        std::operator+(&local_f0,&local_110,"\' property is not an array");
        std::__cxx11::string::operator+=((string *)err,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          __return_storage_ptr__ = &end.m_it.primitive_iterator;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__," in ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         it.m_it.primitive_iterator.m_it);
          std::__cxx11::string::operator+=((string *)err,(string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&end.m_it.primitive_iterator);
        }
        std::__cxx11::string::operator+=((string *)err,".\n");
      }
      ret_local._7_1_ = false;
    }
  }
  else {
    if ((required) && (err != (string *)0x0)) {
      std::operator+(&local_a0,"\'",property);
      std::operator+(&local_80,&local_a0,"\' property is missing");
      std::__cxx11::string::operator+=((string *)err,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::operator+(&local_d0," in ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       it.m_it.primitive_iterator.m_it);
        std::__cxx11::string::operator+=((string *)err,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      std::__cxx11::string::operator+=((string *)err,".\n");
    }
    ret_local._7_1_ = false;
  }
  return ret_local._7_1_;
}

Assistant:

static bool ParseNumberArrayProperty(std::vector<double> *ret, std::string *err,
                                     const json &o, const std::string &property,
                                     bool required,
                                     const std::string &parent_node = "") {
  json_const_iterator it;
  if (!FindMember(o, property.c_str(), it)) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is missing";
        if (!parent_node.empty()) {
          (*err) += " in " + parent_node;
        }
        (*err) += ".\n";
      }
    }
    return false;
  }

  if (!IsArray(GetValue(it))) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is not an array";
        if (!parent_node.empty()) {
          (*err) += " in " + parent_node;
        }
        (*err) += ".\n";
      }
    }
    return false;
  }

  ret->clear();
  auto end = ArrayEnd(GetValue(it));
  for (auto i = ArrayBegin(GetValue(it)); i != end; ++i) {
    double numberValue;
    const bool isNumber = GetNumber(*i, numberValue);
    if (!isNumber) {
      if (required) {
        if (err) {
          (*err) += "'" + property + "' property is not a number.\n";
          if (!parent_node.empty()) {
            (*err) += " in " + parent_node;
          }
          (*err) += ".\n";
        }
      }
      return false;
    }
    ret->push_back(numberValue);
  }

  return true;
}